

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_list.cpp
# Opt level: O3

void __thiscall libtorrent::aux::tracker_list::stop_announcing(tracker_list *this,time_point32 now)

{
  node_ptr plVar1;
  announce_entry *t;
  node_ptr plVar2;
  node_ptr plVar3;
  
  for (plVar2 = (this->m_trackers).super_type.data_.root_plus_size_.m_header.super_node.next_;
      plVar2 != &(this->m_trackers).super_type.data_.root_plus_size_.m_header.super_node;
      plVar2 = plVar2->next_) {
    plVar1 = plVar2[5].prev_;
    for (plVar3 = plVar2[5].next_; plVar3 != plVar1; plVar3 = (node_ptr)&plVar3[0xc].prev_) {
      *(duration *)&plVar3[5].next_ = now.__d.__r;
      ((duration *)((long)&plVar3[5].next_ + 4))->__r = (rep_conflict)now.__d.__r;
      *(duration *)&plVar3[9].prev_ = now.__d.__r;
      ((duration *)((long)&plVar3[9].prev_ + 4))->__r = (rep_conflict)now.__d.__r;
    }
  }
  return;
}

Assistant:

void tracker_list::stop_announcing(time_point32 const now)
{
	INVARIANT_CHECK;

	for (auto& t : m_trackers)
	{
		for (auto& aep : t.endpoints)
		{
			for (auto& a : aep.info_hashes)
			{
				a.next_announce = now;
				a.min_announce = now;
			}
		}
	}
}